

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_cmpi_8_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar2 = pmmu_translate_addr(uVar2);
    }
    uVar1 = m68k_read_memory_16(uVar2 & m68ki_cpu.address_mask);
    uVar2 = OPER_PCDI_8();
    m68ki_cpu.n_flag = uVar2 - (uVar1 & 0xff);
    m68ki_cpu.not_z_flag = m68ki_cpu.n_flag & 0xff;
    m68ki_cpu.v_flag = (uVar2 ^ m68ki_cpu.n_flag) & (uVar1 & 0xff ^ uVar2);
    m68ki_cpu.c_flag = m68ki_cpu.n_flag;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_cmpi_8_pcdi(void)
{
    if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	// if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint src = OPER_I_8();
		uint dst = OPER_PCDI_8();
		uint res = dst - src;

		FLAG_N = NFLAG_8(res);
		FLAG_Z = MASK_OUT_ABOVE_8(res);
		FLAG_V = VFLAG_SUB_8(src, dst, res);
		FLAG_C = CFLAG_8(res);
		return;
	}
	m68ki_exception_illegal();
}